

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall cppnet::Dispatcher::~Dispatcher(Dispatcher *this)

{
  bool bVar1;
  id __x;
  Dispatcher *this_local;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Dispatcher_00165d30;
  __x = std::this_thread::get_id();
  bVar1 = std::operator!=(__x,(id)(this->_local_thread_id)._M_thread);
  if (bVar1) {
    (*(this->super_Thread)._vptr_Thread[3])();
    (*(this->super_Thread)._vptr_Thread[4])();
  }
  std::weak_ptr<cppnet::CppNetBase>::~weak_ptr(&this->_cppnet_base);
  std::shared_ptr<cppnet::EventActions>::~shared_ptr(&this->_event_actions);
  std::shared_ptr<cppnet::Timer>::~shared_ptr(&this->_timer);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->_task_list);
  std::enable_shared_from_this<cppnet::Dispatcher>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<cppnet::Dispatcher>);
  Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Dispatcher::~Dispatcher() {
    if (std::this_thread::get_id() != _local_thread_id) {
        Stop();
        Join();
    }
}